

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parsePrecPrimary(Parser *this)

{
  int iVar1;
  pointer pcVar2;
  double dVar3;
  undefined8 uVar4;
  long lVar5;
  CompileContext *pCVar6;
  size_type *psVar7;
  ParseError *__return_storage_ptr__;
  pointer *__ptr;
  Parser *in_RSI;
  bool bVar8;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> expr;
  Token paren;
  undefined1 local_a8 [8];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  undefined1 local_50 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  __buckets_ptr local_38;
  
  if ((in_RSI->m_current).type == INTEGER) {
    advance(in_RSI);
    pCVar6 = (CompileContext *)(in_RSI->m_previous).lexeme._M_dataplus._M_p;
    in_RSI = (Parser *)__errno_location();
    iVar1 = *(int *)&in_RSI->m_context;
    *(int *)&in_RSI->m_context = 0;
    lVar5 = strtol((char *)pCVar6,(char **)local_80,10);
    if ((CompileContext *)local_80._0_8_ == pCVar6) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar5 == lVar5) && (*(int *)&in_RSI->m_context != 0x22)) {
      if (*(int *)&in_RSI->m_context == 0) {
        *(int *)&in_RSI->m_context = iVar1;
      }
      local_80._0_8_ = operator_new(0x10);
      (((CompileContext *)local_80._0_8_)->m_source)._M_dataplus._M_p = (pointer)&PTR__Expr_00129750
      ;
      *(int *)&(((CompileContext *)local_80._0_8_)->m_source)._M_string_length = (int)lVar5;
      goto LAB_001110f1;
    }
    std::__throw_out_of_range("stoi");
  }
  else {
    if ((in_RSI->m_current).type != FLOAT) {
LAB_00111077:
      if ((in_RSI->m_current).type == TRUE) {
        advance(in_RSI);
        local_80._0_8_ = operator_new(0x10);
        (((CompileContext *)local_80._0_8_)->m_source)._M_dataplus._M_p =
             (pointer)&PTR__Expr_00129438;
        *(undefined1 *)&(((CompileContext *)local_80._0_8_)->m_source)._M_string_length = 1;
LAB_001110f1:
        this->m_context = (CompileContext *)local_80._0_8_;
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      if ((in_RSI->m_current).type == FALSE) {
        advance(in_RSI);
        local_80._0_8_ = operator_new(0x10);
        (((CompileContext *)local_80._0_8_)->m_source)._M_dataplus._M_p =
             (pointer)&PTR__Expr_00129438;
        *(undefined1 *)&(((CompileContext *)local_80._0_8_)->m_source)._M_string_length = 0;
        goto LAB_001110f1;
      }
      if ((in_RSI->m_current).type == STRING) {
        advance(in_RSI);
        pCVar6 = (CompileContext *)operator_new(0x28);
        pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
        local_80._0_8_ = local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
        (pCVar6->m_source)._M_dataplus._M_p = (pointer)&PTR__StringExpr_001297e0;
        psVar7 = (size_type *)((long)&(pCVar6->m_source).field_2 + 8);
        (pCVar6->m_source)._M_string_length = (size_type)psVar7;
        if ((undefined1 *)local_80._0_8_ == local_70) {
          *psVar7 = local_70._0_8_;
          (pCVar6->m_options).m_filename._M_dataplus._M_p = (pointer)local_70._8_8_;
        }
        else {
          (pCVar6->m_source)._M_string_length = local_80._0_8_;
          *(undefined8 *)((long)&(pCVar6->m_source).field_2 + 8) = local_70._0_8_;
        }
        (pCVar6->m_source).field_2._M_allocated_capacity = local_80._8_8_;
        this->m_context = pCVar6;
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      if ((in_RSI->m_current).type == INTERPOLATION) {
        advance(in_RSI);
        parseInterpolationExpr(this);
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      if ((in_RSI->m_current).type == IDENTIFIER) {
        advance(in_RSI);
        std::make_unique<enact::SymbolExpr,enact::Token&>((Token *)local_80);
        goto LAB_001110f1;
      }
      if ((in_RSI->m_current).type == LEFT_PAREN) {
        advance(in_RSI);
        local_80._0_4_ = (in_RSI->m_previous).type;
        pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
        local_80._8_8_ = local_70 + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_80 + 8),pcVar2,
                   pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
        local_70._28_2_ = (in_RSI->m_previous).col;
        local_70._24_4_ = (in_RSI->m_previous).line;
        if ((in_RSI->m_current).type == RIGHT_PAREN) {
          advance(in_RSI);
          std::make_unique<enact::UnitExpr,enact::Token>((Token *)local_a0);
          uVar4 = local_a0._0_8_;
          local_a0._0_8_ = (CompileContext *)0x0;
          this->m_context = (CompileContext *)uVar4;
        }
        else {
          parseExpr((Parser *)local_a8);
          if ((in_RSI->m_current).type == RIGHT_PAREN) {
            advance(in_RSI);
            this->m_context = (CompileContext *)local_a8;
            local_a8 = (undefined1  [8])0x0;
          }
          else {
            local_48._M_allocated_capacity = 0;
            local_48._8_4_ = 0;
            local_48._12_2_ = 0;
            local_48._14_2_ = 0;
            local_38 = (__buckets_ptr)0x0;
            std::
            vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
            ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                      ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                        *)(local_50 + 8),
                       (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_a8);
            bVar8 = (in_RSI->m_current).type == COMMA;
            if (bVar8) {
              do {
                advance(in_RSI);
                if (!bVar8) break;
                parseExpr((Parser *)local_a0);
                std::
                vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                ::emplace_back<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>
                          ((vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>
                            *)(local_50 + 8),
                           (unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *)local_a0);
                if ((CompileContext *)local_a0._0_8_ != (CompileContext *)0x0) {
                  (**(code **)(*(long *)local_a0._0_8_ + 8))();
                }
                bVar8 = (in_RSI->m_current).type == COMMA;
              } while (bVar8);
            }
            local_a0._0_8_ = (CompileContext *)local_90;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a0,"Expected \')\' after tuple elements.","");
            expect(in_RSI,RIGHT_PAREN,(string *)local_a0);
            if ((CompileContext *)local_a0._0_8_ != (CompileContext *)local_90) {
              operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
            }
            std::
            make_unique<enact::TupleExpr,std::vector<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>,std::allocator<std::unique_ptr<enact::Expr,std::default_delete<enact::Expr>>>>,enact::Token>
                      ((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                        *)local_a0,(Token *)(local_50 + 8));
            uVar4 = local_a0._0_8_;
            local_a0._0_8_ = (CompileContext *)0x0;
            this->m_context = (CompileContext *)uVar4;
            std::
            vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
            ::~vector((vector<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>,_std::allocator<std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>_>_>
                       *)(local_50 + 8));
          }
          if (local_a8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_a8 + 8))();
          }
        }
        if ((undefined1 *)local_80._8_8_ == local_70 + 8) {
          return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
                 (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
        }
        operator_delete((void *)local_80._8_8_,(ulong)(local_70._8_8_ + 1));
        return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
               (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
      }
      goto LAB_001113fe;
    }
    advance(in_RSI);
    pCVar6 = (CompileContext *)(in_RSI->m_previous).lexeme._M_dataplus._M_p;
    in_RSI = (Parser *)__errno_location();
    iVar1 = *(int *)&in_RSI->m_context;
    *(int *)&in_RSI->m_context = 0;
    dVar3 = strtod((char *)pCVar6,(char **)local_80);
    if ((CompileContext *)local_80._0_8_ != pCVar6) {
      local_50 = (undefined1  [8])dVar3;
      if (*(int *)&in_RSI->m_context == 0) {
        *(int *)&in_RSI->m_context = iVar1;
      }
      else if (*(int *)&in_RSI->m_context == 0x22) {
        std::__throw_out_of_range("stod");
        goto LAB_00111077;
      }
      local_80._0_8_ = operator_new(0x10);
      (((CompileContext *)local_80._0_8_)->m_source)._M_dataplus._M_p = (pointer)&PTR__Expr_00129798
      ;
      (((CompileContext *)local_80._0_8_)->m_source)._M_string_length = (size_type)local_50;
      goto LAB_001110f1;
    }
  }
  std::__throw_invalid_argument("stod");
LAB_001113fe:
  __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
  local_80._0_8_ = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"Expected expression.","");
  errorAtCurrent(__return_storage_ptr__,in_RSI,(string *)local_80);
  __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrecPrimary() {
        if (consume(TokenType::INTEGER)) {
            return std::make_unique<IntegerExpr>(std::stoi(m_previous.lexeme));
        }
        if (consume(TokenType::FLOAT)) {
            return std::make_unique<FloatExpr>(std::stod(m_previous.lexeme));
        }

        if (consume(TokenType::TRUE))  {
            return std::make_unique<BooleanExpr>(true);
        }
        if (consume(TokenType::FALSE)) {
            return std::make_unique<BooleanExpr>(false);
        }

        if (consume(TokenType::STRING)) {
            return std::make_unique<StringExpr>(m_previous.lexeme);
        }

        if (consume(TokenType::INTERPOLATION)) {
            return parseInterpolationExpr();
        }

        if (consume(TokenType::IDENTIFIER)) {
            return std::make_unique<SymbolExpr>(m_previous);
        }

        if (consume(TokenType::LEFT_PAREN)) {
            Token paren = m_previous;

            // Unit type ()
            if (consume(TokenType::RIGHT_PAREN)) return std::make_unique<UnitExpr>(std::move(paren));

            // Grouping (expr)
            std::unique_ptr<Expr> expr = parseExpr();
            if (consume(TokenType::RIGHT_PAREN)) return expr;

            // Tuple (expr, expr...)
            std::vector<std::unique_ptr<Expr>> elems{};
            elems.push_back(std::move(expr));
            while (consume(TokenType::COMMA)) {
                elems.push_back(parseExpr());
            }

            expect(TokenType::RIGHT_PAREN, "Expected ')' after tuple elements.");

            return std::make_unique<TupleExpr>(std::move(elems), std::move(paren));
        }

        throw errorAtCurrent("Expected expression.");
    }